

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O0

Value * Kvm::openOutputPortProc(Kvm *vm,Value *args)

{
  bool bVar1;
  KatException *this;
  Value *pVVar2;
  unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  local_68 [3];
  undefined1 local_50 [8];
  string msg;
  unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  out;
  char *filename;
  String *s;
  Value *args_local;
  Kvm *vm_local;
  
  car(args);
  std::make_unique<std::ofstream,char_const*&>((char **)((long)&msg.field_2 + 8));
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)(msg.field_2._M_local_buf + 8));
  if (!bVar1) {
    std::__cxx11::string::string((string *)local_50);
    std::__cxx11::string::append((char *)local_50);
    std::__cxx11::string::append(local_50);
    std::__cxx11::string::append(local_50);
    this = (KatException *)__cxa_allocate_exception(0x10);
    anon_unknown.dwarf_ebf5::KatException::KatException(this,(string *)local_50);
    __cxa_throw(this,&(anonymous_namespace)::KatException::typeinfo,
                anon_unknown.dwarf_ebf5::KatException::~KatException);
  }
  std::
  unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ::unique_ptr(local_68,(unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                         *)((long)&msg.field_2 + 8));
  pVVar2 = makeOutputPort(vm,local_68);
  std::
  unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ::~unique_ptr(local_68);
  std::
  unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                 *)((long)&msg.field_2 + 8));
  return pVVar2;
}

Assistant:

const Value* Kvm::openOutputPortProc(Kvm *vm, const Value *args)
{
    const String *s = static_cast<const String *>(car(args));
    auto filename = s->value_;
    std::unique_ptr<std::ofstream> out = std::make_unique<std::ofstream>(filename);
    if (!out)
    {
        std::string msg;
        msg.append("could not open file \"");
        msg.append(filename);
        msg.append("\"");
        throw KatException(msg);
    }
    return vm->makeOutputPort(std::move(out));
}